

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

int json_value_equals(JSON_Value *a,JSON_Value *b)

{
  double dVar1;
  double dVar2;
  JSON_Value_Type JVar3;
  JSON_Value_Type JVar4;
  int iVar5;
  int iVar6;
  JSON_Array *array;
  JSON_Array *array_00;
  size_t sVar7;
  size_t sVar8;
  JSON_Object *object;
  JSON_Object *object_00;
  JSON_String *pJVar9;
  JSON_String *pJVar10;
  JSON_Value *in_RSI;
  JSON_Value *in_RDI;
  JSON_Value_Type b_type;
  JSON_Value_Type a_type;
  size_t i;
  size_t b_count;
  size_t a_count;
  char *key;
  JSON_String *b_string;
  JSON_String *a_string;
  JSON_Array *b_array;
  JSON_Array *a_array;
  JSON_Object *b_object;
  JSON_Object *a_object;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  JSON_Object *in_stack_ffffffffffffff78;
  ulong local_68;
  JSON_Value *b_00;
  uint local_4;
  
  b_00 = (JSON_Value *)0x0;
  JVar3 = json_value_get_type(in_RDI);
  JVar4 = json_value_get_type(in_RSI);
  if (JVar3 == JVar4) {
    switch(JVar3) {
    default:
      local_4 = 1;
      break;
    case 1:
      local_4 = 1;
      break;
    case 2:
      pJVar9 = json_value_get_string_desc
                         ((JSON_Value *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      pJVar10 = json_value_get_string_desc
                          ((JSON_Value *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if ((pJVar9 == (JSON_String *)0x0) || (pJVar10 == (JSON_String *)0x0)) {
        local_4 = 0;
      }
      else {
        local_4 = 0;
        if (pJVar9->length == pJVar10->length) {
          iVar5 = memcmp(pJVar9->chars,pJVar10->chars,pJVar9->length);
          local_4 = (uint)(iVar5 == 0) << 0x18;
        }
        local_4 = local_4 >> 0x18;
      }
      break;
    case 3:
      dVar1 = json_value_get_number
                        ((JSON_Value *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                        );
      dVar2 = json_value_get_number
                        ((JSON_Value *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                        );
      local_4 = (uint)(ABS(dVar1 - dVar2) < 1e-06);
      break;
    case 4:
      object = json_value_get_object
                         ((JSON_Value *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      object_00 = json_value_get_object
                            ((JSON_Value *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      sVar7 = json_object_get_count(object);
      sVar8 = json_object_get_count(object_00);
      if (sVar7 == sVar8) {
        for (local_68 = 0; local_68 < sVar7; local_68 = local_68 + 1) {
          json_object_get_name
                    (in_stack_ffffffffffffff78,
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          in_stack_ffffffffffffff78 =
               (JSON_Object *)
               json_object_get_value
                         (in_stack_ffffffffffffff78,
                          (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          json_object_get_value
                    (in_stack_ffffffffffffff78,
                     (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          iVar5 = json_value_equals(in_RSI,(JSON_Value *)object);
          if (iVar5 == 0) {
            return 0;
          }
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
      break;
    case 5:
      array = json_value_get_array
                        ((JSON_Value *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                        );
      array_00 = json_value_get_array
                           ((JSON_Value *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      sVar7 = json_array_get_count(array);
      sVar8 = json_array_get_count(array_00);
      if (sVar7 == sVar8) {
        for (local_68 = 0; local_68 < sVar7; local_68 = local_68 + 1) {
          json_array_get_value
                    ((JSON_Array *)in_stack_ffffffffffffff78,
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          json_array_get_value
                    ((JSON_Array *)in_stack_ffffffffffffff78,
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          iVar5 = json_value_equals(in_RSI,b_00);
          if (iVar5 == 0) {
            return 0;
          }
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
      break;
    case 6:
      iVar5 = json_value_get_boolean
                        ((JSON_Value *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                        );
      iVar6 = json_value_get_boolean((JSON_Value *)CONCAT44(in_stack_ffffffffffffff74,iVar5));
      local_4 = (uint)(iVar5 == iVar6);
      break;
    case -1:
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int json_value_equals(const JSON_Value *a, const JSON_Value *b) {
    JSON_Object *a_object = NULL, *b_object = NULL;
    JSON_Array *a_array = NULL, *b_array = NULL;
    const JSON_String *a_string = NULL, *b_string = NULL;
    const char *key = NULL;
    size_t a_count = 0, b_count = 0, i = 0;
    JSON_Value_Type a_type, b_type;
    a_type = json_value_get_type(a);
    b_type = json_value_get_type(b);
    if (a_type != b_type) {
        return PARSON_FALSE;
    }
    switch (a_type) {
        case JSONArray:
            a_array = json_value_get_array(a);
            b_array = json_value_get_array(b);
            a_count = json_array_get_count(a_array);
            b_count = json_array_get_count(b_array);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                if (!json_value_equals(json_array_get_value(a_array, i),
                                       json_array_get_value(b_array, i))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONObject:
            a_object = json_value_get_object(a);
            b_object = json_value_get_object(b);
            a_count = json_object_get_count(a_object);
            b_count = json_object_get_count(b_object);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                key = json_object_get_name(a_object, i);
                if (!json_value_equals(json_object_get_value(a_object, key),
                                       json_object_get_value(b_object, key))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONString:
            a_string = json_value_get_string_desc(a);
            b_string = json_value_get_string_desc(b);
            if (a_string == NULL || b_string == NULL) {
                return PARSON_FALSE; /* shouldn't happen */
            }
            return a_string->length == b_string->length &&
                   memcmp(a_string->chars, b_string->chars, a_string->length) == 0;
        case JSONBoolean:
            return json_value_get_boolean(a) == json_value_get_boolean(b);
        case JSONNumber:
            return fabs(json_value_get_number(a) - json_value_get_number(b)) < 0.000001; /* EPSILON */
        case JSONError:
            return PARSON_TRUE;
        case JSONNull:
            return PARSON_TRUE;
        default:
            return PARSON_TRUE;
    }
}